

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

bool CheckSkipGameBlock(FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool filter;
  FScanner *sc_local;
  
  FScanner::MustGetStringName(sc,"(");
  bVar2 = false;
  do {
    bVar1 = bVar2;
    FScanner::MustGetString(sc);
    bVar3 = CheckGame(sc->String,false);
    bVar4 = FScanner::CheckString(sc,",");
    bVar2 = bVar1 || bVar3;
  } while (bVar4);
  FScanner::MustGetStringName(sc,")");
  if (!bVar1 && !bVar3) {
    SkipSubBlock(sc);
  }
  sc_local._7_1_ = !bVar1 && !bVar3;
  return sc_local._7_1_;
}

Assistant:

static bool CheckSkipGameBlock(FScanner &sc)
{
	bool filter = false;
	sc.MustGetStringName("(");
	do
	{
		sc.MustGetString();
		filter |= CheckGame(sc.String, false);
	}
	while (sc.CheckString(","));
	sc.MustGetStringName(")");
	if (!filter)
	{
		SkipSubBlock(sc);
		return true;
	}
	return false;
}